

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  ArenaImpl *this_00;
  _func_int **pp_Var1;
  int iVar2;
  Extension *pEVar3;
  LazyMessageExtension *pLVar4;
  undefined4 extraout_var;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  
  pVar5 = Insert(this,number);
  pEVar3 = pVar5.first;
  pEVar3->descriptor = descriptor;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pLVar4 = (pEVar3->field_0).lazymessage_value;
  }
  else {
    pEVar3->type = type;
    pEVar3->is_repeated = true;
    this_00 = (ArenaImpl *)this->arena_;
    if (this_00 == (ArenaImpl *)0x0) {
      pLVar4 = (LazyMessageExtension *)operator_new(0x18);
      pLVar4->_vptr_LazyMessageExtension = (_func_int **)0x0;
      pLVar4[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
      pLVar4[2]._vptr_LazyMessageExtension = (_func_int **)0x0;
    }
    else {
      if ((this_00->lifecycle_id_ & 1) != 0) {
        AddMessage((ExtensionSet *)this_00);
      }
      pLVar4 = (LazyMessageExtension *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (this_00,0x18,
                          arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                         );
      pLVar4->_vptr_LazyMessageExtension = (_func_int **)this_00;
      pLVar4[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
      pLVar4[2]._vptr_LazyMessageExtension = (_func_int **)0x0;
    }
    (pEVar3->field_0).lazymessage_value = pLVar4;
  }
  pp_Var1 = pLVar4[2]._vptr_LazyMessageExtension;
  if (pp_Var1 != (_func_int **)0x0) {
    iVar2 = *(int *)&pLVar4[1]._vptr_LazyMessageExtension;
    if (iVar2 < *(int *)pp_Var1) {
      *(int *)&pLVar4[1]._vptr_LazyMessageExtension = iVar2 + 1;
      if ((MessageLite *)pp_Var1[(long)iVar2 + 1] != (MessageLite *)0x0) {
        return (MessageLite *)pp_Var1[(long)iVar2 + 1];
      }
    }
  }
  iVar2 = (*prototype->_vptr_MessageLite[4])(prototype,this->arena_);
  RepeatedPtrFieldBase::
  AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
            ((RepeatedPtrFieldBase *)(pEVar3->field_0).int64_value,
             (MessageLite *)CONCAT44(extraout_var,iVar2));
  return (MessageLite *)CONCAT44(extraout_var,iVar2);
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
        Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  }

  // RepeatedPtrField<MessageLite> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result = reinterpret_cast<internal::RepeatedPtrFieldBase*>(
                            extension->repeated_message_value)
                            ->AddFromCleared<GenericTypeHandler<MessageLite>>();
  if (result == NULL) {
    result = prototype.New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}